

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O1

void __thiscall ProductFormUpdate::ftran(ProductFormUpdate *this,HVector *rhs)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pcVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  if (this->valid_ == true) {
    if (0 < rhs->count) {
      lVar6 = 0;
      do {
        (rhs->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start[(rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6]] = '\x01';
        lVar6 = lVar6 + 1;
      } while (lVar6 < rhs->count);
    }
    if (0 < this->update_count_) {
      lVar6 = 0;
      do {
        iVar1 = (this->pivot_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        pdVar3 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (ABS(pdVar3[iVar1]) <= 1e-14) {
          pdVar3[iVar1] = 0.0;
        }
        else {
          dVar8 = pdVar3[iVar1] /
                  (this->pivot_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          pdVar3[iVar1] = dVar8;
          piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar1 = piVar4[lVar6];
          lVar7 = (long)iVar1;
          if (iVar1 < piVar4[lVar6 + 1]) {
            do {
              iVar1 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7];
              pdVar3 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar3[iVar1] =
                   (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7] * -dVar8 + pdVar3[iVar1];
              pcVar5 = (rhs->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (pcVar5[iVar1] == '\0') {
                pcVar5[iVar1] = '\x01';
                iVar2 = rhs->count;
                rhs->count = iVar2 + 1;
                (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2] = iVar1;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar6 + 1]);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->update_count_);
    }
    if (0 < rhs->count) {
      lVar6 = 0;
      do {
        (rhs->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start[(rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6]] = '\0';
        lVar6 = lVar6 + 1;
      } while (lVar6 < rhs->count);
    }
  }
  return;
}

Assistant:

void ProductFormUpdate::ftran(HVector& rhs) const {
  if (!valid_) return;
  assert(rhs.size == num_row_);
  assert((int)start_.size() == update_count_ + 1);
  // Use the zeroed rhs.cwork to record whether a row is in the index
  // list. If RHS fill-in occurs in a row, then we have to add it to
  // the list. We're not tracking cancellation, so we don't need to
  // know where a row appears in the list
  vector<char>& in_index = rhs.cwork;
  for (HighsInt iX = 0; iX < rhs.count; iX++) in_index[rhs.index[iX]] = 1;

  for (HighsInt iX = 0; iX < update_count_; iX++) {
    const HighsInt pivot_index = pivot_index_[iX];
    double pivot_value = rhs.array[pivot_index];
    if (fabs(pivot_value) > kHighsTiny) {
      assert(in_index[pivot_index]);
      pivot_value /= pivot_value_[iX];
      rhs.array[pivot_index] = pivot_value;
      for (HighsInt iEl = start_[iX]; iEl < start_[iX + 1]; iEl++) {
        HighsInt iRow = index_[iEl];
        rhs.array[iRow] -= pivot_value * value_[iEl];
        if (in_index[iRow]) continue;
        in_index[iRow] = 1;
        rhs.index[rhs.count++] = iRow;
      }
    } else {
      rhs.array[pivot_index] = 0;
    }
  }
  // Zero the in_index entries used to point into the index list
  for (HighsInt iX = 0; iX < rhs.count; iX++) in_index[rhs.index[iX]] = 0;
}